

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagnosticEngine.cpp
# Opt level: O0

SourceLocation __thiscall
slang::getMatchingMacroLoc
          (slang *this,SourceManager *sm,SourceLocation loc,SourceLocation contextLoc,bool isStart,
          span<const_slang::BufferID,_18446744073709551615UL> commonArgs)

{
  span<const_slang::BufferID,_18446744073709551615UL> commonArgs_00;
  span<const_slang::BufferID,_18446744073709551615UL> commonArgs_01;
  bool bVar1;
  SourceLocation contextLoc_00;
  SourceLocation contextLoc_01;
  undefined7 in_register_00000081;
  SourceRange SVar2;
  iterator in_stack_fffffffffffffe88;
  iterator in_stack_fffffffffffffe90;
  SourceLocation local_148;
  SourceLocation argLoc;
  SourceLocation local_118;
  SourceLocation macroLoc;
  SourceRange local_100;
  SourceLocation local_f0;
  SourceLocation local_e8;
  SourceLocation orig_1;
  SourceLocation local_d8;
  SourceLocation local_c0;
  SourceLocation local_b8;
  SourceRange local_a0;
  SourceLocation local_90;
  SourceLocation local_88;
  SourceLocation orig;
  undefined1 local_70 [8];
  SourceRange macroArgRange;
  SourceRange macroRange;
  BufferID local_44;
  BufferID local_40;
  byte local_39;
  SourceManager *pSStack_38;
  bool isStart_local;
  SourceManager *sm_local;
  span<const_slang::BufferID,_18446744073709551615UL> commonArgs_local;
  SourceLocation contextLoc_local;
  SourceLocation loc_local;
  
  sm_local = (SourceManager *)CONCAT71(in_register_00000081,isStart);
  local_39 = contextLoc._0_1_ & 1;
  pSStack_38 = (SourceManager *)this;
  commonArgs_local.size_ = (size_type)loc;
  contextLoc_local = (SourceLocation)sm;
  local_40 = SourceLocation::buffer(&contextLoc_local);
  local_44 = SourceLocation::buffer((SourceLocation *)&commonArgs_local.size_);
  bVar1 = BufferID::operator==(&local_40,&local_44);
  if (bVar1) {
    loc_local = contextLoc_local;
  }
  else {
    bVar1 = SourceManager::isMacroLoc(pSStack_38,contextLoc_local);
    if (bVar1) {
      SourceRange::SourceRange((SourceRange *)&macroArgRange.endLoc);
      SourceRange::SourceRange((SourceRange *)local_70);
      bVar1 = SourceManager::isMacroArgLoc(pSStack_38,contextLoc_local);
      if (bVar1) {
        in_stack_fffffffffffffe88 =
             nonstd::span_lite::span<const_slang::BufferID,_18446744073709551615UL>::begin
                       ((span<const_slang::BufferID,_18446744073709551615UL> *)&sm_local);
        in_stack_fffffffffffffe90 =
             nonstd::span_lite::span<const_slang::BufferID,_18446744073709551615UL>::end
                       ((span<const_slang::BufferID,_18446744073709551615UL> *)&sm_local);
        orig._4_4_ = SourceLocation::buffer(&contextLoc_local);
        bVar1 = std::binary_search<slang::BufferID_const*,slang::BufferID>
                          (in_stack_fffffffffffffe88,in_stack_fffffffffffffe90,
                           (BufferID *)&orig.field_0x4);
        if (bVar1) {
          local_90 = contextLoc_local;
          local_88 = SourceManager::getOriginalLoc(pSStack_38,contextLoc_local);
          SourceRange::SourceRange(&local_a0,local_88,local_88);
          macroArgRange.endLoc = local_a0.startLoc;
        }
        SVar2 = SourceManager::getExpansionRange(pSStack_38,contextLoc_local);
        local_c0 = SVar2.startLoc;
        local_70 = (undefined1  [8])local_c0;
        local_b8 = SVar2.endLoc;
        macroArgRange.startLoc = local_b8;
      }
      else {
        orig_1 = contextLoc_local;
        SVar2 = SourceManager::getExpansionRange(pSStack_38,contextLoc_local);
        local_d8 = SVar2.startLoc;
        macroArgRange.endLoc = local_d8;
        local_f0 = contextLoc_local;
        macroLoc = SourceManager::getOriginalLoc(pSStack_38,contextLoc_local);
        local_e8 = macroLoc;
        SourceRange::SourceRange(&local_100,macroLoc,macroLoc);
        local_70 = (undefined1  [8])local_100.startLoc;
        macroArgRange.startLoc = local_100.endLoc;
      }
      if ((local_39 & 1) == 0) {
        local_118 = SourceRange::end((SourceRange *)&macroArgRange.endLoc);
      }
      else {
        local_118 = SourceRange::start((SourceRange *)&macroArgRange.endLoc);
      }
      bVar1 = SourceLocation::operator_cast_to_bool(&local_118);
      if (bVar1) {
        contextLoc_00._1_7_ = 0;
        contextLoc_00._0_1_ = local_39 & 1;
        commonArgs_00.size_ = (size_type)in_stack_fffffffffffffe90;
        commonArgs_00.data_ = in_stack_fffffffffffffe88;
        local_118 = getMatchingMacroLoc((slang *)pSStack_38,(SourceManager *)local_118,
                                        (SourceLocation)commonArgs_local.size_,contextLoc_00,
                                        SUB81(sm_local,0),commonArgs_00);
        bVar1 = SourceLocation::operator_cast_to_bool(&local_118);
        if (bVar1) {
          return local_118;
        }
      }
      if ((local_39 & 1) == 0) {
        local_148 = SourceRange::end((SourceRange *)local_70);
      }
      else {
        local_148 = SourceRange::start((SourceRange *)local_70);
      }
      contextLoc_01._1_7_ = 0;
      contextLoc_01._0_1_ = local_39 & 1;
      commonArgs_01.size_ = (size_type)in_stack_fffffffffffffe90;
      commonArgs_01.data_ = in_stack_fffffffffffffe88;
      loc_local = getMatchingMacroLoc((slang *)pSStack_38,(SourceManager *)local_148,
                                      (SourceLocation)commonArgs_local.size_,contextLoc_01,
                                      SUB81(sm_local,0),commonArgs_01);
    }
    else {
      SourceLocation::SourceLocation(&loc_local);
    }
  }
  return loc_local;
}

Assistant:

static SourceLocation getMatchingMacroLoc(const SourceManager& sm, SourceLocation loc,
                                          SourceLocation contextLoc, bool isStart,
                                          span<const BufferID> commonArgs) {
    if (loc.buffer() == contextLoc.buffer())
        return loc;

    if (!sm.isMacroLoc(loc))
        return {};

    SourceRange macroRange;
    SourceRange macroArgRange;
    if (sm.isMacroArgLoc(loc)) {
        // Only look at the original location of this argument if the other location
        // in the range is also present in the expansion.
        if (std::binary_search(commonArgs.begin(), commonArgs.end(), loc.buffer())) {
            SourceLocation orig = sm.getOriginalLoc(loc);
            macroRange = SourceRange(orig, orig);
        }
        macroArgRange = sm.getExpansionRange(loc);
    }
    else {
        macroRange = sm.getExpansionRange(loc);

        SourceLocation orig = sm.getOriginalLoc(loc);
        macroArgRange = SourceRange(orig, orig);
    }

    SourceLocation macroLoc = isStart ? macroRange.start() : macroRange.end();
    if (macroLoc) {
        macroLoc = getMatchingMacroLoc(sm, macroLoc, contextLoc, isStart, commonArgs);
        if (macroLoc)
            return macroLoc;
    }

    SourceLocation argLoc = isStart ? macroArgRange.start() : macroArgRange.end();
    return getMatchingMacroLoc(sm, argLoc, contextLoc, isStart, commonArgs);
}